

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

void __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
reentrant_put_transaction<void>::commit(reentrant_put_transaction<void> *this)

{
  ControlBlock *pCVar1;
  uintptr_t uVar2;
  
  if (this->m_queue ==
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0x69f);
  }
  pCVar1 = (this->m_put_data).m_control_block;
  uVar2 = pCVar1->m_next;
  if (((uint)uVar2 & 3) != 1) {
    density_tests::detail::assert_failed<>
              ("(i_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) == detail::Queue_Busy"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0xb3c);
    uVar2 = pCVar1->m_next;
  }
  pCVar1->m_next = uVar2 - 1;
  this->m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  return;
}

Assistant:

void commit() noexcept
            {
                DENSITY_ASSERT(!empty());
                commit_reentrant_put_impl(m_put_data.m_control_block);
                m_queue = nullptr;
            }